

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O2

IRet * __thiscall
vkt::shaderexecutor::Functions::CompMatFuncBase<2,_2>::doApply
          (IRet *__return_storage_ptr__,CompMatFuncBase<2,_2> *this,EvalContext *ctx,IArgs *iargs)

{
  bool *pbVar1;
  long *plVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  undefined1 local_7a;
  undefined1 local_79;
  long local_78;
  long local_70;
  bool *local_68;
  bool *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined8 local_38;
  
  tcu::Matrix<tcu::Interval,_2,_2>::Matrix(__return_storage_ptr__);
  lVar4 = 0;
  for (local_78 = 0; local_78 != 2; local_78 = local_78 + 1) {
    lVar3 = 2;
    local_70 = lVar4;
    while (bVar5 = lVar3 != 0, lVar3 = lVar3 + -1, bVar5) {
      plVar2 = (long *)(**(code **)(*(long *)this + 0x58))(this);
      local_68 = &(iargs->a->m_data).m_data[0].m_data[0].m_hasNaN + lVar4;
      local_60 = &(iargs->b->m_data).m_data[0].m_data[0].m_hasNaN + lVar4;
      local_58 = &local_79;
      local_50 = &local_7a;
      (**(code **)(*plVar2 + 0x40))(&local_48,plVar2,ctx,&local_68);
      *(undefined8 *)((long)&(__return_storage_ptr__->m_data).m_data[0].m_data[0].m_hi + lVar4) =
           local_38;
      pbVar1 = &(__return_storage_ptr__->m_data).m_data[0].m_data[0].m_hasNaN + lVar4;
      *(undefined4 *)pbVar1 = local_48;
      *(undefined4 *)(pbVar1 + 4) = uStack_44;
      *(undefined4 *)(pbVar1 + 8) = uStack_40;
      *(undefined4 *)(pbVar1 + 0xc) = uStack_3c;
      lVar4 = lVar4 + 0x18;
    }
    lVar4 = local_70 + 0x30;
  }
  return __return_storage_ptr__;
}

Assistant:

IRet	doApply	(const EvalContext& ctx, const IArgs& iargs) const
	{
		IRet			ret;

		for (int col = 0; col < Cols; ++col)
		{
			for (int row = 0; row < Rows; ++row)
				ret[col][row] = this->doGetScalarFunc().apply(ctx,
															  iargs.a[col][row],
															  iargs.b[col][row]);
		}

		return ret;
	}